

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

string * __thiscall
t_ocaml_generator::struct_member_copy_of
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type,string *what)

{
  t_type *ptVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string copy_of_v;
  string copy_of_k;
  allocator local_1eb;
  allocator local_1ea;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  iVar3 = (*(type->super_t_doc)._vptr_t_doc[0xb])(type);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(type->super_t_doc)._vptr_t_doc[0xc])(type), (char)iVar3 == '\0')) {
    iVar3 = (*(type->super_t_doc)._vptr_t_doc[0x10])(type);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(type->super_t_doc)._vptr_t_doc[0xf])(type);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(type->super_t_doc)._vptr_t_doc[0xe])(type);
        if ((char)iVar3 == '\0') {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)what);
          return __return_storage_ptr__;
        }
        ptVar1 = *(t_type **)&type[1].super_t_doc.has_doc_;
        std::__cxx11::string::string((string *)&local_a8,"x",(allocator *)&local_1c8);
        struct_member_copy_of(&local_188,this,ptVar1,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        bVar2 = std::operator!=(&local_188,"x");
        if (!bVar2) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)what);
          goto LAB_0025e5de;
        }
        std::__cxx11::string::string
                  ((string *)&local_168,"(List.map (fun x -> ",(allocator *)&local_108);
        std::operator+(&local_1a8,&local_168,&local_188);
        std::__cxx11::string::string((string *)&local_148,") ",(allocator *)&local_c8);
        std::operator+(&local_1e8,&local_1a8,&local_148);
        std::operator+(&local_1c8,&local_1e8,what);
        std::__cxx11::string::string((string *)&local_128,")",(allocator *)&local_e8);
        std::operator+(__return_storage_ptr__,&local_1c8,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_1a8);
        pbVar4 = &local_168;
      }
      else {
        ptVar1 = *(t_type **)&type[1].super_t_doc.has_doc_;
        std::__cxx11::string::string((string *)&local_88,"k",(allocator *)&local_1c8);
        struct_member_copy_of(&local_188,this,ptVar1,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        bVar2 = std::operator==(&local_188,"k");
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)&local_1e8,"(Hashtbl.copy ",(allocator *)&local_168);
          std::operator+(&local_1c8,&local_1e8,what);
          std::__cxx11::string::string((string *)&local_1a8,")",(allocator *)&local_148);
          std::operator+(__return_storage_ptr__,&local_1c8,&local_1a8);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          pbVar4 = &local_1e8;
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_148,
                     "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v -> Hashtbl.add nh "
                     ,(allocator *)&local_c8);
          std::operator+(&local_168,&local_148,&local_188);
          std::__cxx11::string::string((string *)&local_128," true",(allocator *)&local_e8);
          std::operator+(&local_1a8,&local_168,&local_128);
          std::__cxx11::string::string((string *)&local_108,") oh; nh) ",&local_1eb);
          std::operator+(&local_1e8,&local_1a8,&local_108);
          std::operator+(&local_1c8,&local_1e8,what);
          std::operator+(__return_storage_ptr__,&local_1c8,")");
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_168);
          pbVar4 = &local_148;
        }
      }
    }
    else {
      ptVar1 = *(t_type **)&type[1].super_t_doc.has_doc_;
      std::__cxx11::string::string((string *)&local_48,"k",(allocator *)&local_1c8);
      struct_member_copy_of(&local_188,this,ptVar1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      ptVar1 = *(t_type **)&type[1].annotations_._M_t._M_impl;
      std::__cxx11::string::string((string *)&local_68,"v",(allocator *)&local_1e8);
      struct_member_copy_of(&local_1c8,this,ptVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      bVar2 = std::operator==(&local_188,"k");
      if ((bVar2) && (bVar2 = std::operator==(&local_1c8,"v"), bVar2)) {
        std::__cxx11::string::string((string *)&local_1a8,"(Hashtbl.copy ",(allocator *)&local_148);
        std::operator+(&local_1e8,&local_1a8,what);
        std::__cxx11::string::string((string *)&local_168,")",(allocator *)&local_128);
        std::operator+(__return_storage_ptr__,&local_1e8,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_1e8);
        pbVar4 = &local_1a8;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_108,
                   "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v -> Hashtbl.add nh "
                   ,&local_1eb);
        std::operator+(&local_128,&local_108,&local_188);
        std::__cxx11::string::string((string *)&local_c8," ",&local_1e9);
        std::operator+(&local_148,&local_128,&local_c8);
        std::operator+(&local_168,&local_148,&local_1c8);
        std::__cxx11::string::string((string *)&local_e8,") oh; nh) ",&local_1ea);
        std::operator+(&local_1a8,&local_168,&local_e8);
        std::operator+(&local_1e8,&local_1a8,what);
        std::operator+(__return_storage_ptr__,&local_1e8,")");
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_128);
        pbVar4 = &local_108;
      }
      std::__cxx11::string::~string((string *)pbVar4);
      pbVar4 = &local_1c8;
    }
    std::__cxx11::string::~string((string *)pbVar4);
  }
  else {
    std::__cxx11::string::string((string *)&local_188,"#copy",(allocator *)&local_1c8);
    std::operator+(__return_storage_ptr__,what,&local_188);
  }
LAB_0025e5de:
  std::__cxx11::string::~string((string *)&local_188);
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::struct_member_copy_of(t_type* type, string what) {
  if (type->is_struct() || type->is_xception()) {
    return what + string("#copy");
  }
  if (type->is_map()) {
    string copy_of_k = struct_member_copy_of(((t_map*)type)->get_key_type(), "k");
    string copy_of_v = struct_member_copy_of(((t_map*)type)->get_val_type(), "v");

    if (copy_of_k == "k" && copy_of_v == "v") {
      return string("(Hashtbl.copy ") + what + string(")");
    } else {
      return string(
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v "
                 "-> Hashtbl.add nh ") + copy_of_k + string(" ") + copy_of_v + string(") oh; nh) ")
             + what + ")";
    }
  }
  if (type->is_set()) {
    string copy_of = struct_member_copy_of(((t_set*)type)->get_elem_type(), "k");

    if (copy_of == "k") {
      return string("(Hashtbl.copy ") + what + string(")");
    } else {
      return string(
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v "
                 "-> Hashtbl.add nh ") + copy_of + string(" true") + string(") oh; nh) ") + what
             + ")";
    }
  }
  if (type->is_list()) {
    string copy_of = struct_member_copy_of(((t_list*)type)->get_elem_type(), "x");
    if (copy_of != "x") {
      return string("(List.map (fun x -> ") + copy_of + string(") ") + what + string(")");
    } else {
      return what;
    }
  }
  return what;
}